

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_True_Test::iu_AssertionTest_x_iutest_x_True_Test
          (iu_AssertionTest_x_iutest_x_True_Test *this)

{
  iu_AssertionTest_x_iutest_x_True_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__iu_AssertionTest_x_iutest_x_True_Test_00610da0
  ;
  return;
}

Assistant:

IUTEST(AssertionTest, True)
{
    IUTEST_ASSERT_TRUE(true);
    IUTEST_EXPECT_TRUE(true);
    IUTEST_INFORM_TRUE(true);
    IUTEST_EXPECT_TRUE(1);
    IUTEST_EXPECT_TRUE(100==100);
    IUTEST_EXPECT_TRUE(IsEven(2));
#if !defined(IUTEST_NO_VARIADIC_MACROS)
    IUTEST_ASSERT_TRUE(add_t<0, 1>::value);
    IUTEST_EXPECT_TRUE(add_t<0, 1>::value);
    IUTEST_INFORM_TRUE(add_t<0, 1>::value);
    IUTEST_ASSUME_TRUE(add_t<0, 1>::value);
#endif
}